

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_enumerator.cpp
# Opt level: O2

void __thiscall duckdb::PlanEnumerator::GenerateCrossProducts(PlanEnumerator *this)

{
  bool bVar1;
  pointer puVar2;
  JoinRelationSet *left;
  JoinRelationSet *right;
  pointer puVar3;
  QueryGraphManager *this_00;
  idx_t j;
  ulong relation_id;
  ulong index;
  
  this_00 = this->query_graph_manager;
  puVar3 = (this_00->relation_manager).relations.
           super_vector<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this_00->relation_manager).relations.
           super_vector<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (index = 0; index < (ulong)((long)puVar2 - (long)puVar3 >> 3); index = index + 1) {
    left = JoinRelationSetManager::GetJoinRelation(&this_00->set_manager,index);
    relation_id = 0;
    while( true ) {
      this_00 = this->query_graph_manager;
      puVar3 = (this_00->relation_manager).relations.
               super_vector<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar2 = (this_00->relation_manager).relations.
               super_vector<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((ulong)((long)puVar2 - (long)puVar3 >> 3) <= relation_id) break;
      bVar1 = RelationManager::CrossProductWithRelationAllowed(&this_00->relation_manager,index);
      if (bVar1) {
        bVar1 = RelationManager::CrossProductWithRelationAllowed
                          (&this->query_graph_manager->relation_manager,relation_id);
        if ((index != relation_id) && (bVar1)) {
          right = JoinRelationSetManager::GetJoinRelation
                            (&this->query_graph_manager->set_manager,relation_id);
          QueryGraphManager::CreateQueryGraphCrossProduct(this->query_graph_manager,left,right);
        }
      }
      relation_id = relation_id + 1;
    }
  }
  return;
}

Assistant:

void PlanEnumerator::GenerateCrossProducts() {
	// generate a set of cross products to combine the currently available plans into a full join plan
	// we create edges between every relation with a high cost
	for (idx_t i = 0; i < query_graph_manager.relation_manager.NumRelations(); i++) {
		auto &left = query_graph_manager.set_manager.GetJoinRelation(i);
		for (idx_t j = 0; j < query_graph_manager.relation_manager.NumRelations(); j++) {
			auto cross_product_allowed = query_graph_manager.relation_manager.CrossProductWithRelationAllowed(i) &&
			                             query_graph_manager.relation_manager.CrossProductWithRelationAllowed(j);
			if (i != j && cross_product_allowed) {
				auto &right = query_graph_manager.set_manager.GetJoinRelation(j);
				query_graph_manager.CreateQueryGraphCrossProduct(left, right);
			}
		}
	}
	// Now that the query graph has new edges, we need to re-initialize our query graph.
	// TODO: do we need to initialize our qyery graph again?
	// query_graph = query_graph_manager.GetQueryGraph();
}